

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::Mirror(BoardView *this)

{
  undefined8 *puVar1;
  long *plVar2;
  pointer pAVar3;
  float fVar4;
  int iVar5;
  Annotation *ann;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pAVar6;
  iterator __begin1;
  undefined8 *puVar7;
  long *plVar8;
  shared_ptr<Point> *p;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  
  iVar5 = (*this->m_board->_vptr_Board[5])();
  puVar7 = *(undefined8 **)CONCAT44(extraout_var,iVar5);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar5))[1];
  if (puVar7 == puVar1) {
    fVar13 = 1.1754944e-38;
  }
  else {
    fVar13 = 1.1754944e-38;
    puVar9 = puVar7;
    do {
      fVar4 = *(float *)*puVar9;
      if (*(float *)*puVar9 <= fVar13) {
        fVar4 = fVar13;
      }
      fVar13 = fVar4;
      puVar9 = puVar9 + 2;
    } while (puVar9 != puVar1);
  }
  for (; puVar7 != puVar1; puVar7 = puVar7 + 2) {
    *(float *)*puVar7 = fVar13 - *(float *)*puVar7;
  }
  iVar5 = (*this->m_board->_vptr_Board[4])();
  plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var_00,iVar5))[1];
  for (plVar8 = *(long **)CONCAT44(extraout_var_00,iVar5); plVar8 != plVar2; plVar8 = plVar8 + 2) {
    *(float *)(*plVar8 + 0x50) = fVar13 - *(float *)(*plVar8 + 0x50);
  }
  iVar5 = (*this->m_board->_vptr_Board[3])();
  plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var_01,iVar5))[1];
  for (plVar8 = *(long **)CONCAT44(extraout_var_01,iVar5); plVar8 != plVar2; plVar8 = plVar8 + 2) {
    lVar11 = *plVar8;
    *(float *)(lVar11 + 0xd0) = fVar13 - *(float *)(lVar11 + 0xd0);
    if (*(char *)(lVar11 + 0xa0) == '\x01') {
      lVar10 = 0;
      do {
        *(float *)(lVar11 + 0x70 + lVar10 * 8) = fVar13 - *(float *)(lVar11 + 0x70 + lVar10 * 8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
    }
    lVar10 = *(long *)(lVar11 + 0xa8);
    lVar11 = *(long *)(lVar11 + 0xb0) - lVar10;
    if (lVar11 != 0) {
      lVar11 = lVar11 >> 3;
      lVar12 = 0;
      do {
        *(float *)(lVar10 + lVar12 * 8) = fVar13 - *(float *)(lVar10 + lVar12 * 8);
        lVar12 = lVar12 + 1;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
    }
  }
  pAVar6 = (this->m_annotations).annotations.
           super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar3 = (this->m_annotations).annotations.
           super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pAVar6 != pAVar3) {
    do {
      pAVar6->x = (double)fVar13 - pAVar6->x;
      pAVar6 = pAVar6 + 1;
    } while (pAVar6 != pAVar3);
  }
  return;
}

Assistant:

void BoardView::Mirror(void) {
	auto &outline = m_board->OutlinePoints();
	ImVec2 min, max;

	// find the orthagonal bounding box
	// probably can put this as a predefined
	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;
	for (auto &p : outline) {
		if (p->x < min.x) min.x = p->x;
		if (p->y < min.y) min.y = p->y;
		if (p->x > max.x) max.x = p->x;
		if (p->y > max.y) max.y = p->y;
	}

	for (auto &p : outline) {
		p->x = max.x - p->x;
	}

	for (auto &p : m_board->Pins()) {
		//	auto p        = pin.get();
		p->position.x = max.x - p->position.x;
	}

	for (auto &part : m_board->Components()) {

		part->centerpoint.x = max.x - part->centerpoint.x;

		if (part->outline_done) {
			for (size_t i = 0; i < part->outline.size(); i++) {
				part->outline[i].x = max.x - part->outline[i].x;
			}
		}

		for (size_t i = 0; i < part->hull.size(); i++) {
			part->hull[i].x = max.x - part->hull[i].x;
		}
	}

	for (auto &ann : m_annotations.annotations) {
		ann.x = max.x - ann.x;
	}
}